

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

string * __thiscall
cmTarget::ProcessSourceItemCMP0049(string *__return_storage_ptr__,cmTarget *this,string *s)

{
  cmMakefile *this_00;
  bool bVar1;
  PolicyStatus PVar2;
  ostream *poVar3;
  PolicyID id;
  MessageType t;
  string src;
  string local_1c0;
  ostringstream e;
  
  std::__cxx11::string::string((string *)&src,(string *)s);
  cmMakefile::ExpandVariablesInString(this->Makefile,&src);
  bVar1 = std::operator!=(&src,s);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    t = AUTHOR_WARNING;
    PVar2 = cmMakefile::GetPolicyStatus(this->Makefile,CMP0049,false);
    if (PVar2 - NEW < 3) {
      t = FATAL_ERROR;
      bVar1 = true;
LAB_00218eb2:
      poVar3 = std::operator<<((ostream *)&e,"Legacy variable expansion in source file \"");
      poVar3 = std::operator<<(poVar3,(string *)s);
      poVar3 = std::operator<<(poVar3,"\" expanded to \"");
      poVar3 = std::operator<<(poVar3,(string *)&src);
      poVar3 = std::operator<<(poVar3,"\" in target \"");
      poVar3 = std::operator<<(poVar3,(string *)&this->Name);
      std::operator<<(poVar3,"\".  This behavior will be removed in a future version of CMake.");
      this_00 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(this_00,t,&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_1c0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        goto LAB_00218fb7;
      }
    }
    else if (PVar2 != OLD) {
      bVar1 = false;
      if (PVar2 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c0,(cmPolicies *)0x31,id);
        poVar3 = std::operator<<((ostream *)&e,(string *)&local_1c0);
        std::operator<<(poVar3,"\n");
        std::__cxx11::string::~string((string *)&local_1c0);
        bVar1 = false;
        t = AUTHOR_WARNING;
      }
      goto LAB_00218eb2;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)src._M_dataplus._M_p == &src.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(src.field_2._M_allocated_capacity._1_7_,src.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = src.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = src._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(src.field_2._M_allocated_capacity._1_7_,src.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = src._M_string_length;
  src._M_string_length = 0;
  src.field_2._M_local_buf[0] = '\0';
  src._M_dataplus._M_p = (pointer)&src.field_2;
LAB_00218fb7:
  std::__cxx11::string::~string((string *)&src);
  return __return_storage_ptr__;
}

Assistant:

std::string cmTarget::ProcessSourceItemCMP0049(const std::string& s)
{
  std::string src = s;

  // For backwards compatibility replace variables in source names.
  // This should eventually be removed.
  this->Makefile->ExpandVariablesInString(src);
  if (src != s) {
    std::ostringstream e;
    bool noMessage = false;
    MessageType messageType = MessageType::AUTHOR_WARNING;
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0049)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0049) << "\n";
        break;
      case cmPolicies::OLD:
        noMessage = true;
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        messageType = MessageType::FATAL_ERROR;
    }
    if (!noMessage) {
      e << "Legacy variable expansion in source file \"" << s
        << "\" expanded to \"" << src << "\" in target \"" << this->GetName()
        << "\".  This behavior will be removed in a "
           "future version of CMake.";
      this->Makefile->IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return "";
      }
    }
  }
  return src;
}